

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnrealLoader.cpp
# Opt level: O2

void __thiscall
Assimp::UnrealImporter::InternReadFile
          (UnrealImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *__s;
  undefined1 uVar1;
  byte bVar2;
  uint uVar3;
  SharedPostProcessInfo *pSVar4;
  aiMatrix4x4 *paVar5;
  aiMatrix4x4 *paVar6;
  SharedPostProcessInfo *pSVar7;
  MeshFlags *pMVar8;
  aiMatrix4x4 *out;
  float fVar9;
  SharedPostProcessInfo *pSVar10;
  bool bVar11;
  char cVar12;
  uchar uVar13;
  __type _Var14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  short sVar18;
  uint i_2;
  int iVar19;
  uint uVar20;
  long lVar21;
  Logger *pLVar22;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  aiNode *this_00;
  IOStream *pIVar24;
  __normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
  _Var25;
  aiMesh **ppaVar26;
  aiMaterial **ppaVar27;
  uint *puVar28;
  aiMesh *paVar29;
  ulong *puVar30;
  aiFace *paVar31;
  aiVector3D *paVar32;
  aiMaterial *this_01;
  size_t sVar33;
  pointer ppVar34;
  DeadlyImportError *pDVar35;
  char cVar36;
  aiMatrix4x4 *paVar37;
  aiFace *paVar38;
  uint i_1;
  uchar (*pauVar39) [2];
  pointer v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pTVar40;
  string *this_02;
  uint i;
  Triangle *tri_1;
  pointer pTVar41;
  ulong uVar42;
  pointer pTVar43;
  uint i2;
  long lVar44;
  ulong uVar45;
  int twosided;
  undefined4 uStack_5ec;
  uchar (*local_5e8) [2];
  aiScene *local_5e0;
  long *local_5d8;
  aiNode *local_5d0;
  vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> materials;
  FlipWindingOrderProcess flipper;
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  textures;
  StreamReaderLE d_reader;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> triangles;
  string extension;
  string a_path;
  string d_path;
  StreamReaderLE a_reader;
  string uc_path;
  MakeLeftHandedProcess hero;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  size_type local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408 [61];
  long *plVar23;
  undefined4 extraout_var_03;
  
  local_5e0 = pScene;
  local_5d0 = (aiNode *)this;
  std::__cxx11::string::rfind((char)pFile,0x2e);
  BaseImporter::GetExtension(&extension,pFile);
  d_path._M_dataplus._M_p = (pointer)&d_path.field_2;
  d_path._M_string_length = 0;
  a_path._M_dataplus._M_p = (pointer)&a_path.field_2;
  a_path._M_string_length = 0;
  d_path.field_2._M_local_buf[0] = '\0';
  a_path.field_2._M_local_buf[0] = '\0';
  uc_path._M_dataplus._M_p = (pointer)&uc_path.field_2;
  uc_path._M_string_length = 0;
  uc_path.field_2._M_local_buf[0] = '\0';
  bVar11 = std::operator==(&extension,"3d");
  if (bVar11) {
    lVar21 = std::__cxx11::string::rfind((char)pFile,0x5f);
    if (lVar21 == -1) {
      pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hero,"UNREAL: Unexpected naming scheme",(allocator<char> *)&d_reader);
      DeadlyImportError::DeadlyImportError(pDVar35,(string *)&hero);
      __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)&hero,(ulong)pFile);
  }
  else {
    std::__cxx11::string::substr((ulong)&hero,(ulong)pFile);
  }
  std::__cxx11::string::operator=((string *)&extension,(string *)&hero);
  std::__cxx11::string::~string((string *)&hero);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hero,
                 &extension,"_d.3d");
  std::__cxx11::string::operator=((string *)&d_path,(string *)&hero);
  std::__cxx11::string::~string((string *)&hero);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hero,
                 &extension,"_a.3d");
  std::__cxx11::string::operator=((string *)&a_path,(string *)&hero);
  std::__cxx11::string::~string((string *)&hero);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hero,
                 &extension,".uc");
  std::__cxx11::string::operator=((string *)&uc_path,(string *)&hero);
  std::__cxx11::string::~string((string *)&hero);
  pLVar22 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&hero,
             (char (*) [22])"UNREAL: data file is ");
  std::operator<<((ostream *)&hero,(string *)&d_path);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar22,(char *)d_reader.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  std::__cxx11::string::~string((string *)&d_reader);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&hero);
  pLVar22 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&hero,
             (char (*) [22])"UNREAL: aniv file is ");
  std::operator<<((ostream *)&hero,(string *)&a_path);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar22,(char *)d_reader.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  std::__cxx11::string::~string((string *)&d_reader);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&hero);
  pLVar22 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[20]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&hero,
             (char (*) [20])"UNREAL: uc file is ");
  std::operator<<((ostream *)&hero,(string *)&uc_path);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar22,(char *)d_reader.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  std::__cxx11::string::~string((string *)&d_reader);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&hero);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hero,"rb",(allocator<char> *)&d_reader);
  iVar19 = (*pIOHandler->_vptr_IOSystem[4])
                     (pIOHandler,d_path._M_dataplus._M_p,
                      CONCAT44(hero.super_BaseProcess._vptr_BaseProcess._4_4_,
                               (int)hero.super_BaseProcess._vptr_BaseProcess));
  plVar23 = (long *)CONCAT44(extraout_var,iVar19);
  std::__cxx11::string::~string((string *)&hero);
  local_5d8 = plVar23;
  if (plVar23 == (long *)0x0) {
    pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&hero,"UNREAL: Unable to open _d file",(allocator<char> *)&d_reader);
    DeadlyImportError::DeadlyImportError(pDVar35,(string *)&hero);
    __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hero,"rb",(allocator<char> *)&a_reader);
  iVar19 = (*pIOHandler->_vptr_IOSystem[4])
                     (pIOHandler,d_path._M_dataplus._M_p,
                      CONCAT44(hero.super_BaseProcess._vptr_BaseProcess._4_4_,
                               (int)hero.super_BaseProcess._vptr_BaseProcess));
  StreamReader<false,_false>::StreamReader
            (&d_reader,(IOStream *)CONCAT44(extraout_var_00,iVar19),false);
  std::__cxx11::string::~string((string *)&hero);
  uVar15 = StreamReader<false,_false>::Get<short>(&d_reader);
  uVar16 = StreamReader<false,_false>::Get<short>(&d_reader);
  StreamReader<false,_false>::IncPtr(&d_reader,0x2c);
  if ((uVar15 == 0) || (uVar16 < 3)) {
    pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&hero,"UNREAL: Invalid number of vertices/triangles",
               (allocator<char> *)&a_reader);
    DeadlyImportError::DeadlyImportError(pDVar35,(string *)&hero);
    __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::vector
            (&triangles,(ulong)uVar15,(allocator_type *)&hero);
  pTVar43 = triangles.
            super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pauVar39 = (triangles.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_start)->mTex;
  pTVar41 = triangles.
            super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pTVar41 == pTVar43) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hero,"rb",(allocator<char> *)&a_reader);
      iVar19 = (*pIOHandler->_vptr_IOSystem[4])
                         (pIOHandler,a_path._M_dataplus._M_p,
                          CONCAT44(hero.super_BaseProcess._vptr_BaseProcess._4_4_,
                                   (int)hero.super_BaseProcess._vptr_BaseProcess));
      (**(code **)(*local_5d8 + 8))();
      std::__cxx11::string::~string((string *)&hero);
      if ((long *)CONCAT44(extraout_var_01,iVar19) == (long *)0x0) {
        pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&hero,"UNREAL: Unable to open _a file",(allocator<char> *)&a_reader);
        DeadlyImportError::DeadlyImportError(pDVar35,(string *)&hero);
        __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_5d8 = (long *)CONCAT44(extraout_var_01,iVar19);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hero,"rb",(allocator<char> *)&vertices);
      iVar19 = (*pIOHandler->_vptr_IOSystem[4])
                         (pIOHandler,a_path._M_dataplus._M_p,
                          CONCAT44(hero.super_BaseProcess._vptr_BaseProcess._4_4_,
                                   (int)hero.super_BaseProcess._vptr_BaseProcess));
      StreamReader<false,_false>::StreamReader
                (&a_reader,(IOStream *)CONCAT44(extraout_var_02,iVar19),false);
      std::__cxx11::string::~string((string *)&hero);
      sVar18 = StreamReader<false,_false>::Get<short>(&a_reader);
      if ((uint)(int)sVar18 <= *(uint32_t *)((long)local_5d0 + 0x78)) {
        pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&hero,"UNREAL: The requested frame does not exist",
                   (allocator<char> *)&vertices);
        DeadlyImportError::DeadlyImportError(pDVar35,(string *)&hero);
        __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      sVar18 = StreamReader<false,_false>::Get<short>(&a_reader);
      if ((uint)uVar16 * 4 != (int)sVar18) {
        pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&hero,"UNREAL: Unexpected aniv file length",
                   (allocator<char> *)&vertices);
        DeadlyImportError::DeadlyImportError(pDVar35,(string *)&hero);
        __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      StreamReader<false,_false>::IncPtr
                (&a_reader,(ulong)((int)sVar18 * *(uint32_t *)((long)local_5d0 + 0x78)));
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                (&vertices,(ulong)uVar16,(allocator_type *)&hero);
      for (v = vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          v != vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish; v = v + 1) {
        iVar19 = StreamReader<false,_false>::Get<int>(&a_reader);
        Unreal::DecompressVertex(v,iVar19);
      }
      textures.
      super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      textures.
      super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      textures.
      super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      local_5e0->mRootNode = this_00;
      local_5d0 = this_00;
      aiString::Set((aiString *)this_00,"<UnrealRoot>");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hero,"rb",(allocator<char> *)&materials);
      iVar19 = (*pIOHandler->_vptr_IOSystem[4])
                         (pIOHandler,uc_path._M_dataplus._M_p,
                          CONCAT44(hero.super_BaseProcess._vptr_BaseProcess._4_4_,
                                   (int)hero.super_BaseProcess._vptr_BaseProcess));
      pIVar24 = (IOStream *)CONCAT44(extraout_var_03,iVar19);
      std::__cxx11::string::~string((string *)&hero);
      local_5e8 = (uchar (*) [2])pIVar24;
      if (pIVar24 == (IOStream *)0x0) {
        pLVar22 = DefaultLogger::get();
        Logger::error(pLVar22,"Unable to open .uc file");
      }
      else {
        materials.
        super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        materials.
        super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        materials.
        super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        BaseImporter::TextFileToBuffer
                  (pIVar24,(vector<char,_std::allocator<char>_> *)&materials,FORBID_EMPTY);
        flipper.super_BaseProcess.progress = (ProgressHandler *)0x0;
        flipper.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
        flipper.super_BaseProcess.shared = (SharedPostProcessInfo *)0x0;
        paVar5 = &local_5d0->mTransformation;
        paVar6 = &local_5d0->mTransformation;
        paVar37 = &local_5d0->mTransformation;
        for (_twosided = materials.
                         super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            (char)_twosided->type != MF_NORMAL_OS; _twosided = (pointer)((long)&_twosided->type + 1)
            ) {
          bVar11 = TokenMatchI((char **)&twosided,"#exec",5);
          if (bVar11) {
            SkipSpacesAndLineEnd<char>((char **)&twosided);
            bVar11 = TokenMatchI((char **)&twosided,"TEXTURE",7);
            if (bVar11) {
              SkipSpacesAndLineEnd<char>((char **)&twosided);
              bVar11 = TokenMatchI((char **)&twosided,"IMPORT",6);
              if (bVar11) {
                hero.super_BaseProcess._vptr_BaseProcess =
                     (_func_int **)&hero.super_BaseProcess.progress;
                hero.super_BaseProcess.shared._0_4_ = 0;
                hero.super_BaseProcess.shared._4_4_ = 0;
                hero.super_BaseProcess.progress =
                     (ProgressHandler *)
                     ((ulong)hero.super_BaseProcess.progress & 0xffffffffffffff00);
                local_420._8_8_ = local_408;
                local_410 = 0;
                local_408[0]._M_local_buf[0] = '\0';
                std::
                vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                            *)&flipper,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&hero);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&hero);
                pSVar10 = flipper.super_BaseProcess.shared;
                pSVar4 = flipper.super_BaseProcess.shared + -2;
                pSVar7 = flipper.super_BaseProcess.shared + -1;
                while( true ) {
                  uVar20 = (uint)(byte)(char)_twosided->type;
                  if ((uVar20 < 0xe) && ((0x3401U >> (uVar20 & 0x1f) & 1) != 0)) break;
                  iVar19 = ASSIMP_strincmp((char *)_twosided,"NAME=",5);
                  if (iVar19 == 0) {
                    pMVar8 = &_twosided->tex;
                    while( true ) {
                      _twosided = (pointer)((long)pMVar8 + 1);
                      uVar42 = (ulong)(byte)(char)_twosided->type;
                      if ((uVar42 < 0x21) && ((0x100003601U >> (uVar42 & 0x3f) & 1) != 0)) break;
                      pMVar8 = &_twosided->type;
                    }
                    hero.super_BaseProcess._vptr_BaseProcess =
                         (_func_int **)&hero.super_BaseProcess.progress;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&hero);
                    this_02 = (string *)
                              &(pSVar4->pmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_004cdd37:
                    std::__cxx11::string::operator=(this_02,(string *)&hero);
                    std::__cxx11::string::~string((string *)&hero);
                  }
                  else {
                    iVar19 = ASSIMP_strincmp((char *)_twosided,"FILE=",5);
                    if (iVar19 == 0) {
                      pMVar8 = &_twosided->tex;
                      while( true ) {
                        _twosided = (pointer)((long)pMVar8 + 1);
                        uVar42 = (ulong)(byte)(char)_twosided->type;
                        if ((uVar42 < 0x21) && ((0x100003601U >> (uVar42 & 0x3f) & 1) != 0)) break;
                        pMVar8 = &_twosided->type;
                      }
                      hero.super_BaseProcess._vptr_BaseProcess =
                           (_func_int **)&hero.super_BaseProcess.progress;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&hero);
                      this_02 = (string *)
                                &(pSVar7->pmap)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_parent;
                      goto LAB_004cdd37;
                    }
                  }
                  _twosided = (pointer)((long)&_twosided->type + 1);
                }
                if ((pSVar10[-2].pmap._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
                   (pSVar10[-1].pmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
                    (_Base_ptr)0x0)) {
                  flipper.super_BaseProcess.shared =
                       (SharedPostProcessInfo *)
                       &flipper.super_BaseProcess.shared[-2].pmap._M_t._M_impl.super__Rb_tree_header
                        ._M_header._M_right;
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)flipper.super_BaseProcess.shared);
                }
              }
            }
            else {
              bVar11 = TokenMatchI((char **)&twosided,"MESHMAP",7);
              if (bVar11) {
                SkipSpacesAndLineEnd<char>((char **)&twosided);
                bVar11 = TokenMatchI((char **)&twosided,"SETTEXTURE",10);
                if (bVar11) {
                  hero.super_BaseProcess._vptr_BaseProcess._0_4_ = 0;
                  hero.super_BaseProcess.shared = (SharedPostProcessInfo *)&local_420;
                  hero.super_BaseProcess.progress = (ProgressHandler *)0x0;
                  local_420._M_local_buf[0] = '\0';
                  std::
                  vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
                  ::emplace_back<std::pair<unsigned_int,std::__cxx11::string>>
                            ((vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
                              *)&textures,
                             (pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&hero);
                  std::__cxx11::string::~string((string *)&hero.super_BaseProcess.shared);
                  ppVar34 = textures.
                            super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  __rhs = &textures.
                           super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].second;
                  while ((uVar20 = (uint)(byte)(char)_twosided->type, 0xd < uVar20 ||
                         ((0x3401U >> (uVar20 & 0x1f) & 1) == 0))) {
                    iVar19 = ASSIMP_strincmp((char *)_twosided,"NUM=",4);
                    if (iVar19 == 0) {
                      _twosided = (pointer)&_twosided->tex;
                      uVar20 = strtoul10((char *)_twosided,(char **)&twosided);
                      ppVar34[-1].first = uVar20;
                    }
                    else {
                      iVar19 = ASSIMP_strincmp((char *)_twosided,"TEXTURE=",8);
                      if (iVar19 == 0) {
                        _twosided = (pointer)&_twosided->numFaces;
                        while ((uVar42 = (ulong)(byte)(char)_twosided->type, 0x20 < uVar42 ||
                               ((0x100003601U >> (uVar42 & 0x3f) & 1) == 0))) {
                          _twosided = (pointer)((long)&_twosided->type + 1);
                        }
                        hero.super_BaseProcess._vptr_BaseProcess =
                             (_func_int **)&hero.super_BaseProcess.progress;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&hero);
                        std::__cxx11::string::operator=((string *)__rhs,(string *)&hero);
                        std::__cxx11::string::~string((string *)&hero);
                        for (__lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)flipper.super_BaseProcess._vptr_BaseProcess;
                            __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)flipper.super_BaseProcess.shared; __lhs = __lhs + 2) {
                          _Var14 = std::operator==(__lhs,__rhs);
                          if (_Var14) {
                            std::__cxx11::string::_M_assign((string *)__rhs);
                            break;
                          }
                        }
                      }
                    }
                    _twosided = (pointer)((long)&_twosided->type + 1);
                  }
                }
                else {
                  bVar11 = TokenMatchI((char **)&twosided,"SCALE",5);
                  if (bVar11) {
                    do {
                      uVar1 = (undefined1)_twosided->type;
                      if (uVar1 == 0x58) {
                        bVar2 = *(byte *)((long)&_twosided->type + 1);
                        out = paVar37;
joined_r0x004cdf78:
                        if (bVar2 == 0x3d) {
                          _twosided = (pointer)fast_atoreal_move<float>
                                                         ((char *)((long)&_twosided->type + 2),
                                                          &out->a1,true);
                        }
                      }
                      else {
                        if (uVar1 == 0x59) {
                          bVar2 = *(byte *)((long)&_twosided->type + 1);
                          out = (aiMatrix4x4 *)&paVar6->b2;
                          goto joined_r0x004cdf78;
                        }
                        uVar20 = (uint)(byte)uVar1;
                        if (uVar20 == 0x5a) {
                          bVar2 = *(byte *)((long)&_twosided->type + 1);
                          out = (aiMatrix4x4 *)&paVar5->c3;
                          goto joined_r0x004cdf78;
                        }
                        if ((uVar20 < 0xe) && ((0x3401U >> (uVar20 & 0x1f) & 1) != 0)) break;
                      }
                      _twosided = (pointer)((long)&_twosided->type + 1);
                    } while( true );
                  }
                }
              }
            }
          }
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&flipper);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&materials);
      }
      materials.
      super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      materials.
      super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      materials.
      super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::reserve
                (&materials,
                 (((long)textures.
                         super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)textures.
                        super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x28) * 2 + 5);
      pTVar43 = triangles.
                super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pSVar4 = hero.super_BaseProcess.shared;
      for (pTVar41 = triangles.
                     super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                     ._M_impl.super__Vector_impl_data._M_start; pIVar24 = (IOStream *)local_5e8,
          hero.super_BaseProcess.shared._4_4_ = (undefined4)((ulong)pSVar4 >> 0x20),
          pTVar41 != pTVar43; pTVar41 = pTVar41 + 1) {
        hero.super_BaseProcess._vptr_BaseProcess._0_4_ = (int)pTVar41->mType;
        hero.super_BaseProcess._vptr_BaseProcess._4_4_ = (uint)pTVar41->mTextureNum;
        hero.super_BaseProcess.shared._0_4_ = 0;
        _Var25 = std::
                 __find_if<__gnu_cxx::__normal_iterator<Assimp::Unreal::TempMat*,std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::Unreal::TempMat_const>>
                           (materials.
                            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            materials.
                            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(value_type *)&hero);
        pTVar41->matIndex =
             (uint)(((long)_Var25._M_current -
                    (long)materials.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc);
        if (_Var25._M_current ==
            materials.
            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          hero.super_BaseProcess.shared._0_4_ = 1;
          std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::push_back
                    (&materials,(value_type *)&hero);
          local_5e0->mNumMeshes = local_5e0->mNumMeshes + 1;
        }
        else {
          (_Var25._M_current)->numFaces = (_Var25._M_current)->numFaces + 1;
        }
        pSVar4 = (SharedPostProcessInfo *)
                 CONCAT44(hero.super_BaseProcess.shared._4_4_,hero.super_BaseProcess.shared._0_4_);
      }
      uVar20 = local_5e0->mNumMeshes;
      uVar42 = (ulong)uVar20;
      hero.super_BaseProcess.shared = pSVar4;
      if (uVar42 == 0) {
        pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&hero,"UNREAL: Unable to find valid mesh data",
                   (allocator<char> *)&flipper);
        DeadlyImportError::DeadlyImportError(pDVar35,(string *)&hero);
        __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      ppaVar26 = (aiMesh **)operator_new__(uVar42 * 8);
      local_5e0->mMeshes = ppaVar26;
      local_5e0->mNumMaterials = uVar20;
      ppaVar27 = (aiMaterial **)operator_new__(uVar42 * 8);
      local_5e0->mMaterials = ppaVar27;
      local_5d0->mNumMeshes = uVar20;
      puVar28 = (uint *)operator_new__(uVar42 << 2);
      local_5d0->mMeshes = puVar28;
      uVar45 = 0;
      do {
        if (uVar42 <= uVar45) {
          pSVar4 = hero.super_BaseProcess.shared;
          for (pTVar43 = triangles.
                         super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              hero.super_BaseProcess.shared._4_4_ = (undefined4)((ulong)pSVar4 >> 0x20),
              pTVar43 !=
              triangles.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_finish; pTVar43 = pTVar43 + 1) {
            hero.super_BaseProcess._vptr_BaseProcess._0_4_ = (int)pTVar43->mType;
            hero.super_BaseProcess._vptr_BaseProcess._4_4_ = (uint)pTVar43->mTextureNum;
            hero.super_BaseProcess.shared._0_4_ = 0;
            _Var25 = std::
                     __find_if<__gnu_cxx::__normal_iterator<Assimp::Unreal::TempMat*,std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::Unreal::TempMat_const>>
                               (materials.
                                super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                materials.
                                super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&hero);
            paVar29 = local_5e0->mMeshes
                      [((long)_Var25._M_current -
                       (long)materials.
                             super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc];
            paVar31 = paVar29->mFaces;
            uVar20 = paVar29->mNumFaces;
            paVar29->mNumFaces = uVar20 + 1;
            paVar31[uVar20].mNumIndices = 3;
            puVar28 = (uint *)operator_new__(0xc);
            pSVar4 = (SharedPostProcessInfo *)
                     CONCAT44(hero.super_BaseProcess.shared._4_4_,
                              hero.super_BaseProcess.shared._0_4_);
            paVar31[uVar20].mIndices = puVar28;
            for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
              uVar3 = paVar29->mNumVertices;
              paVar31[uVar20].mIndices[lVar21] = uVar3;
              uVar15 = pTVar43->mVertex[lVar21];
              paVar32 = paVar29->mVertices;
              paVar32[uVar3].z =
                   vertices.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15].z;
              fVar9 = vertices.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar15].y;
              paVar32 = paVar32 + uVar3;
              paVar32->x = vertices.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar15].x;
              paVar32->y = fVar9;
              bVar2 = pTVar43->mTex[lVar21][1];
              paVar32 = paVar29->mTextureCoords[0];
              uVar3 = paVar29->mNumVertices;
              paVar32[uVar3].x = (float)pTVar43->mTex[lVar21][0] / 255.0;
              paVar32[uVar3].y = 1.0 - (float)bVar2 / 255.0;
              paVar32[uVar3].z = 0.0;
              paVar29->mNumVertices = paVar29->mNumVertices + 1;
            }
            pIVar24 = (IOStream *)local_5e8;
          }
          hero.super_BaseProcess.shared = pSVar4;
          MakeLeftHandedProcess::MakeLeftHandedProcess(&hero);
          MakeLeftHandedProcess::Execute(&hero,local_5e0);
          FlipWindingOrderProcess::FlipWindingOrderProcess(&flipper);
          FlipWindingOrderProcess::Execute(&flipper,local_5e0);
          FlipWindingOrderProcess::~FlipWindingOrderProcess(&flipper);
          MakeLeftHandedProcess::~MakeLeftHandedProcess(&hero);
          std::_Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::
          ~_Vector_base(&materials.
                         super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                       );
          if (pIVar24 != (IOStream *)0x0) {
            (*pIVar24->_vptr_IOStream[1])(pIVar24);
          }
          std::
          vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&textures);
          std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                    (&vertices.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
          StreamReader<false,_false>::~StreamReader(&a_reader);
          std::_Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::
          ~_Vector_base(&triangles.
                         super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                       );
          StreamReader<false,_false>::~StreamReader(&d_reader);
          (**(code **)(*local_5d8 + 8))();
          std::__cxx11::string::~string((string *)&uc_path);
          std::__cxx11::string::~string((string *)&a_path);
          std::__cxx11::string::~string((string *)&d_path);
          std::__cxx11::string::~string((string *)&extension);
          return;
        }
        paVar29 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(paVar29);
        local_5e0->mMeshes[uVar45] = paVar29;
        paVar29->mPrimitiveTypes = 4;
        uVar20 = materials.
                 super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar45].numFaces;
        uVar42 = (ulong)uVar20;
        puVar30 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
        *puVar30 = uVar42;
        paVar31 = (aiFace *)(puVar30 + 1);
        if (uVar42 != 0) {
          paVar38 = paVar31;
          do {
            paVar38->mNumIndices = 0;
            paVar38->mIndices = (uint *)0x0;
            paVar38 = paVar38 + 1;
          } while (paVar38 != paVar31 + uVar42);
        }
        paVar29->mFaces = paVar31;
        uVar42 = (ulong)(uVar20 * 3) * 0xc;
        paVar32 = (aiVector3D *)operator_new__(uVar42);
        if (uVar20 != 0) {
          memset(paVar32,0,((uVar42 - 0xc) - (uVar42 - 0xc) % 0xc) + 0xc);
        }
        paVar29->mVertices = paVar32;
        paVar32 = (aiVector3D *)operator_new__(uVar42);
        if (uVar20 != 0) {
          memset(paVar32,0,((uVar42 - 0xc) - (uVar42 - 0xc) % 0xc) + 0xc);
        }
        paVar29->mTextureCoords[0] = paVar32;
        local_5d0->mMeshes[uVar45] = (uint)uVar45;
        this_01 = (aiMaterial *)operator_new(0x10);
        pIVar24 = (IOStream *)local_5e8;
        aiMaterial::aiMaterial(this_01);
        __s = (char *)((long)&hero.super_BaseProcess._vptr_BaseProcess + 4);
        local_5e0->mMaterials[uVar45] = this_01;
        flipper.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x3f8000003f800000;
        flipper.super_BaseProcess.shared =
             (SharedPostProcessInfo *)CONCAT44(flipper.super_BaseProcess.shared._4_4_,0x3f800000);
        hero.super_BaseProcess._vptr_BaseProcess._0_4_ = 0;
        hero.super_BaseProcess._vptr_BaseProcess._4_4_ =
             hero.super_BaseProcess._vptr_BaseProcess._4_4_ & 0xffffff00;
        memset((void *)((long)&hero.super_BaseProcess._vptr_BaseProcess + 5),0x1b,0x3ff);
        snprintf(__s,0x400,"mat%u_tx%u_",uVar45 & 0xffffffff);
        pTVar40 = materials.
                  super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (materials.
            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar45].type == MF_NORMAL_TS) {
          _twosided = (pointer)CONCAT44(uStack_5ec,1);
          aiMaterial::AddProperty(this_01,&twosided,1,"$mat.twosided",0,0);
          sVar33 = strlen(__s);
          builtin_strncpy((char *)((long)&local_420 + sVar33 + -0x14),"ts_",4);
          pTVar40 = materials.
                    super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          sVar33 = strlen(__s);
          builtin_strncpy((char *)((long)&local_420 + sVar33 + -0x14),"os_",4);
        }
        if (pTVar40[uVar45].type == MF_NORMAL_TRANS_TS) {
          _twosided = (pointer)CONCAT44(uStack_5ec,0x3f666666);
          aiMaterial::AddProperty(this_01,(float *)&twosided,1,"$mat.opacity",0,0);
          sVar33 = strlen(__s);
          builtin_strncpy(__s + sVar33,"tran",4);
          (local_420._M_local_buf + (sVar33 - 0x10))[0] = '_';
          (local_420._M_local_buf + (sVar33 - 0x10))[1] = '\0';
          pTVar40 = materials.
                    super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          sVar33 = strlen(__s);
          builtin_strncpy(__s + sVar33,"opaq",4);
          (local_420._M_local_buf + (sVar33 - 0x10))[0] = '_';
          (local_420._M_local_buf + (sVar33 - 0x10))[1] = '\0';
        }
        if (pTVar40[uVar45].type == MF_WEAPON_PLACEHOLDER) {
          hero.super_BaseProcess._vptr_BaseProcess._4_4_ = 0x61655724;
          hero.super_BaseProcess.shared = (SharedPostProcessInfo *)0x246761546e6f70;
          flipper.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
          hero.super_BaseProcess._vptr_BaseProcess._0_4_ = 0xb;
          flipper.super_BaseProcess.shared =
               (SharedPostProcessInfo *)
               ((ulong)flipper.super_BaseProcess.shared & 0xffffffff00000000);
        }
        aiMaterial::AddProperty(this_01,(aiColor3D *)&flipper,1,"$clr.diffuse",0,0);
        sVar33 = strlen(__s);
        hero.super_BaseProcess._vptr_BaseProcess._0_4_ = (int)sVar33;
        aiMaterial::AddProperty(this_01,(aiString *)&hero,"?mat.name",0,0);
        for (ppVar34 = textures.
                       super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppVar34 !=
            textures.
            super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; ppVar34 = ppVar34 + 1) {
          if (ppVar34->first ==
              materials.
              super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar45].tex) {
            uVar42 = (ppVar34->second)._M_string_length;
            if (uVar42 < 0x400) {
              hero.super_BaseProcess._vptr_BaseProcess._0_4_ = (int)uVar42;
              memcpy((void *)((long)&hero.super_BaseProcess._vptr_BaseProcess + 4),
                     (ppVar34->second)._M_dataplus._M_p,uVar42);
              local_420._M_local_buf[uVar42 - 0x14] = '\0';
            }
            aiMaterial::AddProperty(this_01,(aiString *)&hero,"$tex.file",1,0);
            break;
          }
        }
        uVar45 = uVar45 + 1;
        uVar42 = (ulong)local_5e0->mNumMeshes;
      } while( true );
    }
    for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
      uVar17 = StreamReader<false,_false>::Get<short>(&d_reader);
      pTVar41->mVertex[lVar21] = uVar17;
      if (uVar15 <= uVar17) {
        pLVar22 = DefaultLogger::get();
        Logger::warn(pLVar22,"UNREAL: vertex index out of range");
        pTVar41->mVertex[lVar21] = 0;
      }
    }
    cVar12 = StreamReader<false,_false>::Get<signed_char>(&d_reader);
    pTVar41->mType = cVar12;
    if (*(bool *)((long)local_5d0 + 0x7c) == false) {
      cVar36 = '\x01';
      if ((byte)(cVar12 - 3U) < 2) goto LAB_004cd8bb;
    }
    else {
      cVar36 = '\0';
LAB_004cd8bb:
      pTVar41->mType = cVar36;
    }
    StreamReader<false,_false>::IncPtr(&d_reader,1);
    local_5e8 = pauVar39;
    for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
      for (lVar44 = 0; lVar44 != 2; lVar44 = lVar44 + 1) {
        uVar13 = StreamReader<false,_false>::Get<signed_char>(&d_reader);
        (*pauVar39)[lVar44] = uVar13;
      }
      pauVar39 = pauVar39 + 1;
    }
    uVar13 = StreamReader<false,_false>::Get<signed_char>(&d_reader);
    pauVar39 = local_5e8;
    pTVar41->mTextureNum = uVar13;
    StreamReader<false,_false>::IncPtr(&d_reader,1);
    pTVar41 = pTVar41 + 1;
    pauVar39 = pauVar39 + 10;
  } while( true );
}

Assistant:

void UnrealImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    // For any of the 3 files being passed get the three correct paths
    // First of all, determine file extension
    std::string::size_type pos = pFile.find_last_of('.');
    std::string extension = GetExtension(pFile);

    std::string d_path,a_path,uc_path;
    if (extension == "3d")      {
        // jjjj_d.3d
        // jjjj_a.3d
        pos = pFile.find_last_of('_');
        if (std::string::npos == pos) {
            throw DeadlyImportError("UNREAL: Unexpected naming scheme");
        }
        extension = pFile.substr(0,pos);
    }
    else {
        extension = pFile.substr(0,pos);
    }

    // build proper paths
    d_path  = extension+"_d.3d";
    a_path  = extension+"_a.3d";
    uc_path = extension+".uc";

    ASSIMP_LOG_DEBUG_F( "UNREAL: data file is ", d_path);
    ASSIMP_LOG_DEBUG_F("UNREAL: aniv file is ", a_path);
    ASSIMP_LOG_DEBUG_F("UNREAL: uc file is ", uc_path);

    // and open the files ... we can't live without them
    std::unique_ptr<IOStream> p(pIOHandler->Open(d_path));
    if (!p)
        throw DeadlyImportError("UNREAL: Unable to open _d file");
    StreamReaderLE d_reader(pIOHandler->Open(d_path));

    const uint16_t numTris = d_reader.GetI2();
    const uint16_t numVert = d_reader.GetI2();
    d_reader.IncPtr(44);
    if (!numTris || numVert < 3)
        throw DeadlyImportError("UNREAL: Invalid number of vertices/triangles");

    // maximum texture index
    unsigned int maxTexIdx = 0;

    // collect triangles
    std::vector<Unreal::Triangle> triangles(numTris);
    for (auto & tri : triangles) {
        for (unsigned int i = 0; i < 3;++i) {

            tri.mVertex[i] = d_reader.GetI2();
            if (tri.mVertex[i] >= numTris)  {
                ASSIMP_LOG_WARN("UNREAL: vertex index out of range");
                tri.mVertex[i] = 0;
            }
        }
        tri.mType = d_reader.GetI1();

        // handle mesh flagss?
        if (configHandleFlags)
            tri.mType = Unreal::MF_NORMAL_OS;
        else {
            // ignore MOD and MASKED for the moment, treat them as two-sided
            if (tri.mType == Unreal::MF_NORMAL_MOD_TS || tri.mType == Unreal::MF_NORMAL_MASKED_TS)
                tri.mType = Unreal::MF_NORMAL_TS;
        }
        d_reader.IncPtr(1);

        for (unsigned int i = 0; i < 3;++i)
            for (unsigned int i2 = 0; i2 < 2;++i2)
                tri.mTex[i][i2] = d_reader.GetI1();

        tri.mTextureNum = d_reader.GetI1();
        maxTexIdx = std::max(maxTexIdx,(unsigned int)tri.mTextureNum);
        d_reader.IncPtr(1);
    }

    p.reset(pIOHandler->Open(a_path));
    if (!p)
        throw DeadlyImportError("UNREAL: Unable to open _a file");
    StreamReaderLE a_reader(pIOHandler->Open(a_path));

    // read number of frames
    const uint32_t numFrames = a_reader.GetI2();
    if (configFrameID >= numFrames)
        throw DeadlyImportError("UNREAL: The requested frame does not exist");

    uint32_t st = a_reader.GetI2();
    if (st != numVert*4)
        throw DeadlyImportError("UNREAL: Unexpected aniv file length");

    // skip to our frame
    a_reader.IncPtr(configFrameID *numVert*4);

    // collect vertices
    std::vector<aiVector3D> vertices(numVert);
    for (auto &vertex : vertices)    {
        int32_t val = a_reader.GetI4();
        Unreal::DecompressVertex(vertex ,val);
    }

    // list of textures.
    std::vector< std::pair<unsigned int, std::string> > textures;

    // allocate the output scene
    aiNode* nd = pScene->mRootNode = new aiNode();
    nd->mName.Set("<UnrealRoot>");

    // we can live without the uc file if necessary
    std::unique_ptr<IOStream> pb (pIOHandler->Open(uc_path));
    if (pb.get())   {

        std::vector<char> _data;
        TextFileToBuffer(pb.get(),_data);
        const char* data = &_data[0];

        std::vector< std::pair< std::string,std::string > > tempTextures;

        // do a quick search in the UC file for some known, usually texture-related, tags
        for (;*data;++data) {
            if (TokenMatchI(data,"#exec",5))    {
                SkipSpacesAndLineEnd(&data);

                // #exec TEXTURE IMPORT [...] NAME=jjjjj [...] FILE=jjjj.pcx [...]
                if (TokenMatchI(data,"TEXTURE",7))  {
                    SkipSpacesAndLineEnd(&data);

                    if (TokenMatchI(data,"IMPORT",6))   {
                        tempTextures.push_back(std::pair< std::string,std::string >());
                        std::pair< std::string,std::string >& me = tempTextures.back();
                        for (;!IsLineEnd(*data);++data) {
                            if (!::ASSIMP_strincmp(data,"NAME=",5)) {
                                const char *d = data+=5;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.first = std::string(d,(size_t)(data-d));
                            }
                            else if (!::ASSIMP_strincmp(data,"FILE=",5))    {
                                const char *d = data+=5;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.second = std::string(d,(size_t)(data-d));
                            }
                        }
                        if (!me.first.length() || !me.second.length())
                            tempTextures.pop_back();
                    }
                }
                // #exec MESHMAP SETTEXTURE MESHMAP=box NUM=1 TEXTURE=Jtex1
                // #exec MESHMAP SCALE MESHMAP=box X=0.1 Y=0.1 Z=0.2
                else if (TokenMatchI(data,"MESHMAP",7)) {
                    SkipSpacesAndLineEnd(&data);

                    if (TokenMatchI(data,"SETTEXTURE",10)) {

                        textures.push_back(std::pair<unsigned int, std::string>());
                        std::pair<unsigned int, std::string>& me = textures.back();

                        for (;!IsLineEnd(*data);++data) {
                            if (!::ASSIMP_strincmp(data,"NUM=",4))  {
                                data += 4;
                                me.first = strtoul10(data,&data);
                            }
                            else if (!::ASSIMP_strincmp(data,"TEXTURE=",8)) {
                                data += 8;
                                const char *d = data;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.second = std::string(d,(size_t)(data-d));

                                // try to find matching path names, doesn't care if we don't find them
                                for (std::vector< std::pair< std::string,std::string > >::const_iterator it = tempTextures.begin();
                                     it != tempTextures.end(); ++it)    {
                                    if ((*it).first == me.second)   {
                                        me.second = (*it).second;
                                        break;
                                    }
                                }
                            }
                        }
                    }
                    else if (TokenMatchI(data,"SCALE",5)) {

                        for (;!IsLineEnd(*data);++data) {
                            if (data[0] == 'X' && data[1] == '=')   {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.a1);
                            }
                            else if (data[0] == 'Y' && data[1] == '=')  {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.b2);
                            }
                            else if (data[0] == 'Z' && data[1] == '=')  {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.c3);
                            }
                        }
                    }
                }
            }
        }
    }
    else    {
        ASSIMP_LOG_ERROR("Unable to open .uc file");
    }

    std::vector<Unreal::TempMat> materials;
    materials.reserve(textures.size()*2+5);

    // find out how many output meshes and materials we'll have and build material indices
	for (Unreal::Triangle &tri : triangles) {
        Unreal::TempMat mat(tri);
        std::vector<Unreal::TempMat>::iterator nt = std::find(materials.begin(),materials.end(),mat);
        if (nt == materials.end()) {
            // add material
            tri.matIndex = static_cast<unsigned int>(materials.size());
            mat.numFaces = 1;
            materials.push_back(mat);

            ++pScene->mNumMeshes;
        }
        else {
            tri.matIndex = static_cast<unsigned int>(nt-materials.begin());
            ++nt->numFaces;
        }
    }

    if (!pScene->mNumMeshes) {
        throw DeadlyImportError("UNREAL: Unable to find valid mesh data");
    }

    // allocate meshes and bind them to the node graph
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials = pScene->mNumMeshes];

    nd->mNumMeshes  = pScene->mNumMeshes;
    nd->mMeshes = new unsigned int[nd->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh* m = pScene->mMeshes[i] =  new aiMesh();
        m->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        const unsigned int num = materials[i].numFaces;
        m->mFaces            = new aiFace     [num];
        m->mVertices         = new aiVector3D [num*3];
        m->mTextureCoords[0] = new aiVector3D [num*3];

        nd->mMeshes[i] = i;

        // create materials, too
        aiMaterial* mat = new aiMaterial();
        pScene->mMaterials[i] = mat;

        // all white by default - texture rulez
        aiColor3D color(1.f,1.f,1.f);

        aiString s;
        ::ai_snprintf( s.data, MAXLEN, "mat%u_tx%u_",i,materials[i].tex );

        // set the two-sided flag
        if (materials[i].type == Unreal::MF_NORMAL_TS) {
            const int twosided = 1;
            mat->AddProperty(&twosided,1,AI_MATKEY_TWOSIDED);
            ::strcat(s.data,"ts_");
        }
        else ::strcat(s.data,"os_");

        // make TRANS faces 90% opaque that RemRedundantMaterials won't catch us
        if (materials[i].type == Unreal::MF_NORMAL_TRANS_TS)    {
            const float opac = 0.9f;
            mat->AddProperty(&opac,1,AI_MATKEY_OPACITY);
            ::strcat(s.data,"tran_");
        }
        else ::strcat(s.data,"opaq_");

        // a special name for the weapon attachment point
        if (materials[i].type == Unreal::MF_WEAPON_PLACEHOLDER) {
            s.length = ::ai_snprintf( s.data, MAXLEN, "$WeaponTag$" );
            color = aiColor3D(0.f,0.f,0.f);
        }

        // set color and name
        mat->AddProperty(&color,1,AI_MATKEY_COLOR_DIFFUSE);
        s.length = ::strlen(s.data);
        mat->AddProperty(&s,AI_MATKEY_NAME);

        // set texture, if any
        const unsigned int tex = materials[i].tex;
        for (std::vector< std::pair< unsigned int, std::string > >::const_iterator it = textures.begin();it != textures.end();++it) {
            if ((*it).first == tex) {
                s.Set((*it).second);
                mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
                break;
            }
        }
    }

    // fill them.
    for (const Unreal::Triangle &tri : triangles) {
        Unreal::TempMat mat(tri);
        std::vector<Unreal::TempMat>::iterator nt = std::find(materials.begin(),materials.end(),mat);

        aiMesh* mesh = pScene->mMeshes[nt-materials.begin()];
        aiFace& f    = mesh->mFaces[mesh->mNumFaces++];
        f.mIndices   = new unsigned int[f.mNumIndices = 3];

        for (unsigned int i = 0; i < 3;++i,mesh->mNumVertices++) {
            f.mIndices[i] = mesh->mNumVertices;

            mesh->mVertices[mesh->mNumVertices] = vertices[ tri.mVertex[i] ];
            mesh->mTextureCoords[0][mesh->mNumVertices] = aiVector3D( tri.mTex[i][0] / 255.f, 1.f - tri.mTex[i][1] / 255.f, 0.f);
        }
    }

    // convert to RH
    MakeLeftHandedProcess hero;
    hero.Execute(pScene);

    FlipWindingOrderProcess flipper;
    flipper.Execute(pScene);
}